

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

MPP_RET update_reference_list(Av1CodecContext *ctx)

{
  AV1RawFrameHeader *pAVar1;
  long lVar2;
  undefined4 local_148;
  undefined4 local_144;
  RK_U32 local_140;
  RK_U32 local_13c;
  RK_U32 local_138;
  RK_U32 local_134;
  RK_U32 local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  RK_U32 local_120;
  RK_U32 local_11c;
  int local_4c;
  int local_48;
  RK_S32 alt2_buf_idx;
  RK_S32 bwd_buf_idx;
  RK_S32 lst_buf_idx;
  RK_S32 alt_buf_idx;
  RK_S32 gld_buf_idx;
  RK_S32 lst3_buf_idx;
  RK_S32 lst2_buf_idx;
  RK_S32 i;
  MPP_RET ret;
  AV1RawFrameHeader *header;
  AV1Context *s;
  Av1CodecContext *ctx_local;
  
  header = (AV1RawFrameHeader *)ctx->priv_data;
  _i = *(char **)(header->buffer_removal_time + 0x13);
  lst2_buf_idx = 0;
  s = (AV1Context *)ctx;
  for (lst3_buf_idx = 0; lst3_buf_idx < 8; lst3_buf_idx = lst3_buf_idx + 1) {
    if (((uint)(byte)_i[0xb1] & 1 << ((byte)lst3_buf_idx & 0x1f)) != 0) {
      lVar2 = (long)lst3_buf_idx;
      pAVar1 = header + 0x72;
      memset(&local_148,0,0xfc);
      local_148 = 1;
      local_144 = *(undefined4 *)(_i + 0x14);
      local_140 = header[6].gm_params[5][4];
      local_13c = header[6].gm_params[5][2];
      local_138 = header[6].gm_params[5][3];
      local_134 = header[6].gm_params[5][5];
      local_130 = header[6].gm_params[6][0];
      local_12c = (uint)(byte)_i[0xc];
      local_128 = (uint)*(byte *)(*(long *)(header->buffer_removal_time + 0xf) + 0x247);
      local_124 = (uint)*(byte *)(*(long *)(header->buffer_removal_time + 0xf) + 0x248);
      local_120 = header[6].gm_params[5][0];
      local_11c = header[6].gm_params[5][1];
      memcpy((void *)((long)pAVar1->gm_params + lVar2 * 0xfc + 0x30),&local_148,0xfc);
      *(undefined8 *)((long)header[0x72].gm_params + (long)lst3_buf_idx * 0xfc + 0x60) =
           *(undefined8 *)(_i + 0x25c);
      *(undefined2 *)((long)&header[0x72].film_grain + (long)lst3_buf_idx * 0xfc + -0x58) =
           *(undefined2 *)(_i + 0x266);
      memcpy((void *)((long)&header[0x72].film_grain + (long)lst3_buf_idx * 0xfc + -0x56),_i + 0x185
             ,0x40);
      memcpy((void *)((long)&header[0x72].film_grain + (long)lst3_buf_idx * 0xfc + -0x16),_i + 0x1c6
             ,0x80);
    }
  }
  if (*_i == '\0') {
    gld_buf_idx = (RK_S32)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc0);
    alt_buf_idx = (RK_S32)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc1);
    lst_buf_idx = (RK_S32)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc2);
    bwd_buf_idx = (RK_S32)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc5);
    alt2_buf_idx = (RK_S32)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xbf);
    local_48 = (int)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc3);
    local_4c = (int)*(char *)(*(long *)(header->buffer_removal_time + 0x13) + 0xc4);
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x10) =
         (uint)(byte)header->delta_frame_id_minus1[(long)gld_buf_idx * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x14) =
         (uint)(byte)header->delta_frame_id_minus1[(long)alt_buf_idx * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x18) =
         (uint)(byte)header->delta_frame_id_minus1[(long)lst_buf_idx * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x24) =
         (uint)(byte)header->delta_frame_id_minus1[(long)bwd_buf_idx * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0xc) =
         (uint)(byte)header->delta_frame_id_minus1[(long)alt2_buf_idx * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x1c) =
         (uint)(byte)header->delta_frame_id_minus1[(long)local_48 * 0xbe];
    *(uint *)(*(long *)(header[6].gm_params[2] + 1) + 0x20) =
         (uint)(byte)header->delta_frame_id_minus1[(long)local_4c * 0xbe];
  }
  lst3_buf_idx = 0;
  do {
    if (7 < lst3_buf_idx) {
      return lst2_buf_idx;
    }
    if ((av1d_debug & 4) != 0) {
      _mpp_log_l(4,"av1d_parser","header->refresh_frame_flags = %d","update_reference_list",
                 (ulong)(byte)_i[0xb1]);
    }
    if (((uint)(byte)_i[0xb1] & 1 << ((byte)lst3_buf_idx & 0x1f)) != 0) {
      if ((av1d_debug & 4) != 0) {
        _mpp_log_l(4,"av1d_parser","av1 ref idx %d s->ref[%d].slot_index %d","update_reference_list"
                   ,(ulong)(uint)lst3_buf_idx,(ulong)(uint)lst3_buf_idx,
                   *(undefined4 *)(header->ref_order_hint + (long)lst3_buf_idx * 0x2f8 + -3));
      }
      if (*(long *)((long)&header->film_grain + (long)lst3_buf_idx * 0x2f8 + 0x2c) != 0) {
        av1d_frame_unref((Av1CodecContext *)s,
                         (AV1Frame *)(header->found_ref + (long)lst3_buf_idx * 0x2f8 + -2));
      }
      lst2_buf_idx = av1d_frame_ref((Av1CodecContext *)s,
                                    (AV1Frame *)
                                    (header->found_ref + (long)lst3_buf_idx * 0x2f8 + -2),
                                    (AV1Frame *)(header[5].film_grain.ar_coeffs_cr_plus_128 + 0x17))
      ;
      if (lst2_buf_idx < 0) {
        _mpp_log_l(2,"av1d_parser","Failed to update frame %d in reference list\n",
                   "update_reference_list",(ulong)(uint)lst3_buf_idx);
        return lst2_buf_idx;
      }
    }
    lst3_buf_idx = lst3_buf_idx + 1;
  } while( true );
}

Assistant:

static MPP_RET update_reference_list(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    const AV1RawFrameHeader *header = s->raw_frame_header;
    MPP_RET ret = MPP_OK;
    RK_S32 i = 0;
    RK_S32 lst2_buf_idx;
    RK_S32 lst3_buf_idx;
    RK_S32 gld_buf_idx;
    RK_S32 alt_buf_idx;
    RK_S32 lst_buf_idx;
    RK_S32 bwd_buf_idx;
    RK_S32 alt2_buf_idx;

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        if (header->refresh_frame_flags & (1 << i)) {
            s->ref_s[i] = (AV1ReferenceFrameState) {
                .valid = 1,
                 .frame_id = header->current_frame_id,
                  .upscaled_width = s->upscaled_width,
                   .frame_width = s->frame_width,
                    .frame_height = s->frame_height,
                     .render_width = s->render_width,
                      .render_height = s->render_height,
                       .frame_type = header->frame_type,
                        .subsampling_x = s->sequence_header->color_config.subsampling_x,
                         .subsampling_y = s->sequence_header->color_config.subsampling_y,
                          .bit_depth = s->bit_depth,
                           .order_hint = s->order_hint,
            };
            memcpy(s->ref_s[i].loop_filter_ref_deltas, header->loop_filter_ref_deltas,
                   sizeof(header->loop_filter_ref_deltas));
            memcpy(s->ref_s[i].loop_filter_mode_deltas, header->loop_filter_mode_deltas,
                   sizeof(header->loop_filter_mode_deltas));
            memcpy(s->ref_s[i].feature_enabled, header->feature_enabled,
                   sizeof(header->feature_enabled));
            memcpy(s->ref_s[i].feature_value, header->feature_value,
                   sizeof(header->feature_value));
        }
    }

    if (!header->show_existing_frame) {
        lst2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST2 - AV1_REF_FRAME_LAST];
        lst3_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST3 - AV1_REF_FRAME_LAST];
        gld_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_GOLDEN - AV1_REF_FRAME_LAST];
        alt_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF - AV1_REF_FRAME_LAST];
        lst_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST - AV1_REF_FRAME_LAST];
        bwd_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_BWDREF - AV1_REF_FRAME_LAST];
        alt2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF2 - AV1_REF_FRAME_LAST];

        s->cur_frame.ref->lst2_frame_offset = s->ref[lst2_buf_idx].order_hint;
        s->cur_frame.ref->lst3_frame_offset = s->ref[lst3_buf_idx].order_hint;
        s->cur_frame.ref->gld_frame_offset  = s->ref[gld_buf_idx].order_hint;
        s->cur_frame.ref->alt_frame_offset  = s->ref[alt_buf_idx].order_hint;
        s->cur_frame.ref->lst_frame_offset  = s->ref[lst_buf_idx].order_hint;
        s->cur_frame.ref->bwd_frame_offset  = s->ref[bwd_buf_idx].order_hint;
        s->cur_frame.ref->alt2_frame_offset = s->ref[alt2_buf_idx].order_hint;
    }

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        av1d_dbg(AV1D_DBG_REF, "header->refresh_frame_flags = %d",
                 header->refresh_frame_flags);
        if (header->refresh_frame_flags & (1 << i)) {
            av1d_dbg(AV1D_DBG_REF, "av1 ref idx %d s->ref[%d].slot_index %d",
                     i, i, s->ref[i].slot_index);
            if (s->ref[i].ref)
                av1d_frame_unref(ctx, &s->ref[i]);

            if ((ret = av1d_frame_ref(ctx, &s->ref[i], &s->cur_frame)) < 0) {
                mpp_err_f("Failed to update frame %d in reference list\n", i);
                return ret;
            }
        }
    }
    return ret;
}